

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O3

int Mpm_ManExploreNewCut
              (Mpm_Man_t *p,Mig_Obj_t *pObj,Mpm_Cut_t *pCut0,Mpm_Cut_t *pCut1,Mpm_Cut_t *pCut2,
              int Required)

{
  Mig_Fan_t MVar1;
  Mig_Fan_t MVar2;
  int iVar3;
  uint uVar4;
  Mpm_Cut_t *pMVar5;
  Mpm_Cut_t *pMVar6;
  Mpm_Cut_t *pMVar7;
  int iVar8;
  Mig_Fan_t MVar9;
  
  if (*(uint *)&pCut0->field_0x4 >> 0x1b < *(uint *)&pCut1->field_0x4 >> 0x1b) {
    pMVar5 = Mpm_ManMergeCuts(p,pCut1,pCut0,pCut2);
    if (pMVar5 == (Mpm_Cut_t *)0x0) goto LAB_0047f583;
    if (p->pPars->fUseTruth == 0) {
      pMVar6 = pMVar5;
      if (p->pPars->fUseDsd != 0) {
        MVar1 = pObj->pFans[0];
        MVar2 = pObj->pFans[1];
        MVar9 = (Mig_Fan_t)~(uint)pObj->pFans[2];
        pMVar5 = pCut0;
        pMVar7 = pCut1;
        if (0xfffffffd < (uint)pObj->pFans[2] && (uint)MVar2 < 0xfffffffe) {
          iVar3 = 1;
          if (((uint)MVar1 >> 1 < (uint)MVar2 >> 1) ||
             (iVar3 = 2, (uint)MVar2 >> 1 < (uint)MVar1 >> 1)) goto LAB_0047f601;
        }
        iVar3 = 3;
LAB_0047f601:
        uVar4 = Mpm_CutComputeDsd6(p,pMVar6,pMVar7,pMVar5,pCut2,(uint)MVar2 & 1,(uint)MVar1 & 1,
                                   (uint)MVar9 & 1,iVar3);
        pMVar5 = (Mpm_Cut_t *)(ulong)uVar4;
        if (uVar4 == 0) goto LAB_0047f583;
      }
    }
    else {
      MVar1 = pObj->pFans[0];
      MVar2 = pObj->pFans[1];
      MVar9 = (Mig_Fan_t)~(uint)pObj->pFans[2];
      pMVar6 = pCut0;
      pMVar7 = pCut1;
      if (0xfffffffd < (uint)pObj->pFans[2] && (uint)MVar2 < 0xfffffffe) {
        iVar3 = 1;
        if (((uint)MVar1 >> 1 < (uint)MVar2 >> 1) ||
           (iVar3 = 2, (uint)MVar2 >> 1 < (uint)MVar1 >> 1)) goto LAB_0047f514;
      }
      iVar3 = 3;
LAB_0047f514:
      Mpm_CutComputeTruth(p,pMVar5,pMVar7,pMVar6,pCut2,(uint)MVar2 & 1,(uint)MVar1 & 1,
                          (uint)MVar9 & 1,iVar3);
      pMVar6 = pMVar5;
    }
  }
  else {
    pMVar5 = Mpm_ManMergeCuts(p,pCut0,pCut1,pCut2);
    if (pMVar5 == (Mpm_Cut_t *)0x0) goto LAB_0047f583;
    if (p->pPars->fUseTruth != 0) {
      MVar2 = pObj->pFans[0];
      MVar1 = pObj->pFans[1];
      MVar9 = pObj->pFans[2];
      pMVar6 = pCut1;
      pMVar7 = pCut0;
      if (0xfffffffd < (uint)MVar9 && (uint)MVar1 < 0xfffffffe) {
        iVar3 = 1;
        if (((uint)MVar2 >> 1 < (uint)MVar1 >> 1) ||
           (iVar3 = 2, (uint)MVar1 >> 1 < (uint)MVar2 >> 1)) goto LAB_0047f514;
      }
      iVar3 = 3;
      goto LAB_0047f514;
    }
    pMVar6 = pMVar5;
    if (p->pPars->fUseDsd != 0) {
      MVar2 = pObj->pFans[0];
      MVar1 = pObj->pFans[1];
      MVar9 = pObj->pFans[2];
      pMVar5 = pCut1;
      pMVar7 = pCut0;
      if (0xfffffffd < (uint)MVar9 && (uint)MVar1 < 0xfffffffe) {
        iVar3 = 1;
        if (((uint)MVar2 >> 1 < (uint)MVar1 >> 1) ||
           (iVar3 = 2, (uint)MVar1 >> 1 < (uint)MVar2 >> 1)) goto LAB_0047f601;
      }
      iVar3 = 3;
      goto LAB_0047f601;
    }
  }
  uVar4 = *(uint *)&pMVar6->field_0x4;
  pMVar5 = (Mpm_Cut_t *)(ulong)uVar4;
  iVar3 = 0;
  if (0x7ffffff < uVar4) {
    pMVar5 = (Mpm_Cut_t *)(ulong)(uVar4 >> 0x1b);
    pMVar7 = (Mpm_Cut_t *)0x0;
    iVar3 = 0;
    do {
      if (pMVar6->pLeaves[(long)pMVar7] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      iVar8 = p->pLibLut->pLutDelays[(long)pMVar5][(long)pMVar7] +
              (p->vTimes).pArray[(uint)pMVar6->pLeaves[(long)pMVar7] >> 1];
      if (iVar3 <= iVar8) {
        iVar3 = iVar8;
      }
      pMVar7 = (Mpm_Cut_t *)((long)&pMVar7->hNext + 1);
    } while (pMVar5 != pMVar7);
  }
  if ((iVar3 <= Required) || (p->fMainRun == 0)) {
    iVar3 = Mpm_ObjAddCutToStore(p,pMVar6,iVar3);
    return iVar3;
  }
LAB_0047f583:
  return (int)pMVar5;
}

Assistant:

static inline int Mpm_ManExploreNewCut( Mpm_Man_t * p, Mig_Obj_t * pObj, Mpm_Cut_t * pCut0, Mpm_Cut_t * pCut1, Mpm_Cut_t * pCut2, int Required )
{
    Mpm_Cut_t * pCut;
    int ArrTime;
#ifdef MIG_RUNTIME
abctime clk = clock();
#endif

    if ( pCut0->nLeaves >= pCut1->nLeaves )
    {
        pCut = Mpm_ManMergeCuts( p, pCut0, pCut1, pCut2 );
#ifdef MIG_RUNTIME
p->timeMerge += clock() - clk;
#endif
        if ( pCut == NULL )
            return 1;
        if ( p->pPars->fUseTruth )
            Mpm_CutComputeTruth( p, pCut, pCut0, pCut1, pCut2, Mig_ObjFaninC0(pObj), Mig_ObjFaninC1(pObj), Mig_ObjFaninC2(pObj), Mig_ObjNodeType(pObj) ); 
        else if ( p->pPars->fUseDsd )
        {
            if ( !Mpm_CutComputeDsd6( p, pCut, pCut0, pCut1, pCut2, Mig_ObjFaninC0(pObj), Mig_ObjFaninC1(pObj), Mig_ObjFaninC2(pObj), Mig_ObjNodeType(pObj) ) )
                return 1;
        }
    }
    else
    {
        pCut = Mpm_ManMergeCuts( p, pCut1, pCut0, pCut2 );
#ifdef MIG_RUNTIME
p->timeMerge += clock() - clk;
#endif
        if ( pCut == NULL )
            return 1;
        if ( p->pPars->fUseTruth )
            Mpm_CutComputeTruth( p, pCut, pCut1, pCut0, pCut2, Mig_ObjFaninC1(pObj), Mig_ObjFaninC0(pObj), 1 ^ Mig_ObjFaninC2(pObj), Mig_ObjNodeType(pObj) ); 
        else if ( p->pPars->fUseDsd )
        {
            if ( !Mpm_CutComputeDsd6( p, pCut, pCut1, pCut0, pCut2, Mig_ObjFaninC1(pObj), Mig_ObjFaninC0(pObj), 1 ^ Mig_ObjFaninC2(pObj), Mig_ObjNodeType(pObj) ) )
                return 1;
        }
    }

#ifdef MIG_RUNTIME
clk = clock();
#endif
    ArrTime = Mpm_CutGetArrTime( p, pCut );
#ifdef MIG_RUNTIME
p->timeEval += clock() - clk;
#endif
    if ( p->fMainRun && ArrTime > Required )
        return 1;

#ifdef MIG_RUNTIME
clk = Abc_Clock();
#endif
    Mpm_ObjAddCutToStore( p, pCut, ArrTime );
#ifdef MIG_RUNTIME
p->timeStore += Abc_Clock() - clk;
#endif

/*
    // return 0 if const or buffer cut is derived - reset all cuts to contain only one --- does not work
//    if ( pCut->nLeaves < 2 && p->nCutStore == 1 )
//        return 0;
    if ( pCut->nLeaves < 2 ) 
    {
        int i;
        assert( p->nCutStore >= 1 );
        for ( i = 1; i < p->nCutStore; i++ )
            Vec_PtrPush( &p->vFreeUnits, p->pCutStore[i] );
        p->nCutStore = 1;
        return 0;
    }
*/
    return 1;
}